

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O1

uint32_t swap4(uint32_t n,int doit)

{
  uint uVar1;
  
  uVar1 = n >> 0x18 | (n & 0xff0000) >> 8 | (n & 0xff00) << 8 | n << 0x18;
  if (doit == 0) {
    uVar1 = n;
  }
  return uVar1;
}

Assistant:

uint32_t swap4(uint32_t n, int doit)
{
    if (doit)
        return (((n & 0x0000ff) << 24) | ((n & 0x0000ff00) <<  8) |
                ((n & 0xff0000) >>  8) | ((n & 0xff000000) >> 24));
    return n;
}